

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool prune_compoundmode_with_singlemode_var
                (PREDICTION_MODE compound_mode,MV_REFERENCE_FRAME ref_frame,
                MV_REFERENCE_FRAME ref_frame2,int_mv (*frame_mv) [8],uint8_t (*mode_checked) [8],
                uint (*vars) [8],int64_t (*uv_dist) [8])

{
  bool bVar1;
  bool bVar2;
  byte mode;
  byte mode_00;
  long in_RCX;
  char in_DL;
  char in_SIL;
  byte in_DIL;
  long in_R8;
  uint (*in_R9) [8];
  _Bool second_ref_bad;
  _Bool first_ref_bad;
  _Bool second_ref_valid;
  _Bool first_ref_valid;
  PREDICTION_MODE single_mode1;
  PREDICTION_MODE single_mode0;
  _Bool local_28;
  _Bool local_27;
  _Bool local_26;
  _Bool local_25;
  _Bool local_1;
  
  mode = compound_ref0_mode(in_DIL);
  mode_00 = compound_ref1_mode(in_DIL);
  bVar1 = false;
  bVar2 = false;
  local_25 = false;
  local_26 = false;
  if (((*(char *)(in_R8 + (ulong)mode * 8 + (long)in_SIL) != '\0') &&
      (*(int *)(in_RCX + (ulong)mode * 0x20 + (long)in_SIL * 4) ==
       *(int *)(in_RCX + (ulong)in_DIL * 0x20 + (long)in_SIL * 4))) &&
     (in_R9[(int)(mode - 0xd)][in_SIL] != 0xffffffff)) {
    bVar1 = true;
    local_25 = previous_mode_performed_poorly(mode,in_SIL,in_R9,(int64_t (*) [8])vars);
  }
  if (((*(char *)(in_R8 + (ulong)mode_00 * 8 + (long)in_DL) != '\0') &&
      (*(int *)(in_RCX + (ulong)mode_00 * 0x20 + (long)in_DL * 4) ==
       *(int *)(in_RCX + (ulong)in_DIL * 0x20 + (long)in_DL * 4))) &&
     (in_R9[(int)(mode_00 - 0xd)][in_DL] != 0xffffffff)) {
    bVar2 = true;
    local_26 = previous_mode_performed_poorly(mode_00,in_DL,in_R9,(int64_t (*) [8])vars);
  }
  if ((bVar1) && (bVar2)) {
    local_27 = false;
    if (local_25 != false) {
      local_27 = local_26;
    }
    local_1 = local_27;
  }
  else if ((bVar1) || (bVar2)) {
    local_28 = true;
    if (local_25 == false) {
      local_28 = local_26;
    }
    local_1 = local_28;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool prune_compoundmode_with_singlemode_var(
    PREDICTION_MODE compound_mode, MV_REFERENCE_FRAME ref_frame,
    MV_REFERENCE_FRAME ref_frame2, const int_mv (*frame_mv)[REF_FRAMES],
    const uint8_t (*mode_checked)[REF_FRAMES],
    const unsigned int (*vars)[REF_FRAMES],
    const int64_t (*uv_dist)[REF_FRAMES]) {
  const PREDICTION_MODE single_mode0 = compound_ref0_mode(compound_mode);
  const PREDICTION_MODE single_mode1 = compound_ref1_mode(compound_mode);

  bool first_ref_valid = false, second_ref_valid = false;
  bool first_ref_bad = false, second_ref_bad = false;
  if (mode_checked[single_mode0][ref_frame] &&
      frame_mv[single_mode0][ref_frame].as_int ==
          frame_mv[compound_mode][ref_frame].as_int &&
      vars[INTER_OFFSET(single_mode0)][ref_frame] < UINT_MAX) {
    first_ref_valid = true;
    first_ref_bad =
        previous_mode_performed_poorly(single_mode0, ref_frame, vars, uv_dist);
  }
  if (mode_checked[single_mode1][ref_frame2] &&
      frame_mv[single_mode1][ref_frame2].as_int ==
          frame_mv[compound_mode][ref_frame2].as_int &&
      vars[INTER_OFFSET(single_mode1)][ref_frame2] < UINT_MAX) {
    second_ref_valid = true;
    second_ref_bad =
        previous_mode_performed_poorly(single_mode1, ref_frame2, vars, uv_dist);
  }
  if (first_ref_valid && second_ref_valid) {
    return first_ref_bad && second_ref_bad;
  } else if (first_ref_valid || second_ref_valid) {
    return first_ref_bad || second_ref_bad;
  }
  return false;
}